

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O1

bool __thiscall QSlider::event(QSlider *this,QEvent *event)

{
  ushort uVar1;
  QSliderPrivate *this_00;
  bool bVar2;
  undefined4 uVar3;
  uint uVar4;
  ulong uVar5;
  QHoverEvent *he;
  ulong uVar6;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar7 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar8 [16];
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSliderPrivate **)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
  uVar1 = *(ushort *)(event + 8);
  if (uVar1 - 0x7f < 3) {
    uVar3 = QEventPoint::position();
    auVar8._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM1_Qa;
    auVar8._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM0_Qa;
    auVar8 = minpd(_DAT_0066f5d0,auVar8);
    auVar7._8_8_ = -(ulong)(-2147483648.0 < auVar8._8_8_);
    auVar7._0_8_ = -(ulong)(-2147483648.0 < auVar8._0_8_);
    uVar4 = movmskpd(uVar3,auVar7);
    uVar6 = 0x8000000000000000;
    if ((uVar4 & 1) != 0) {
      uVar6 = (ulong)(uint)(int)auVar8._0_8_ << 0x20;
    }
    uVar5 = 0x80000000;
    if ((uVar4 & 2) != 0) {
      uVar5 = (ulong)(uint)(int)auVar8._8_8_;
    }
    local_28 = (QPoint)(uVar5 | uVar6);
    QSliderPrivate::updateHoverControl(this_00,&local_28);
  }
  else if ((uVar1 == 100) || (uVar1 == 0xb1)) {
    QSliderPrivate::resetLayoutItemMargins(this_00);
  }
  bVar2 = QAbstractSlider::event(&this->super_QAbstractSlider,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QSlider::event(QEvent *event)
{
    Q_D(QSlider);

    switch(event->type()) {
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
    case QEvent::HoverMove:
        if (const QHoverEvent *he = static_cast<const QHoverEvent *>(event))
            d->updateHoverControl(he->position().toPoint());
        break;
    case QEvent::StyleChange:
    case QEvent::MacSizeChange:
        d->resetLayoutItemMargins();
        break;
    default:
        break;
    }
    return QAbstractSlider::event(event);
}